

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O2

compile_errcode __thiscall
ArgumentList::Action
          (ArgumentList *this,vector<_SymbolType,_std::allocator<_SymbolType>_> *argument_type)

{
  int line_number;
  int character_number;
  pointer pSVar1;
  LogTools *this_00;
  bool bVar2;
  SymbolName SVar3;
  undefined4 uVar4;
  string *name;
  SymbolKind local_7c;
  vector<_SymbolType,_std::allocator<_SymbolType>_> *local_78;
  SymbolName *local_70;
  SymbolTableTerm term;
  
  local_70 = &this->m_type;
  name = &this->m_identifier_name;
  uVar4 = 0;
  local_78 = argument_type;
  do {
    SVar3 = SymbolQueue::GetCurrentName(handle_correct_queue);
    switch(uVar4) {
    case 0:
      if (SVar3 == R_CIRCLE_BRACKET_SYM) {
        return 0;
      }
    case 3:
      if ((SVar3 & ~SWITCH_SYM) != INT_SYM) {
        return -1;
      }
      term.m_name._M_dataplus._M_p._1_3_ = 0;
      term.m_name._M_dataplus._M_p._0_1_ = SVar3 != INT_SYM;
      std::vector<_SymbolType,_std::allocator<_SymbolType>_>::emplace_back<_SymbolType>
                (local_78,(_SymbolType *)&term);
      *local_70 = SVar3;
      uVar4 = 1;
      break;
    case 1:
      if (SVar3 != IDENTIFIER_SYM) {
        return -1;
      }
      pSVar1 = (handle_correct_queue->m_symbol_queue).
               super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.super__Vector_impl_data.
               _M_start;
      line_number = pSVar1[handle_correct_queue->m_current_locate].m_line_number;
      character_number = pSVar1[handle_correct_queue->m_current_locate].m_character_number;
      SymbolQueue::GetCurrentValue<std::__cxx11::string>(&term.m_name,handle_correct_queue);
      std::__cxx11::string::operator=((string *)name,(string *)&term);
      std::__cxx11::string::~string((string *)&term);
      bVar2 = SymbolTableTree::FindTerm(symbol_table_tree,name,true);
      this_00 = g_log_tools;
      if (bVar2) {
        std::__cxx11::string::string
                  ((string *)&term,"repeat definition identifier(para)",(allocator *)&local_7c);
        LogTools::SemanticErrorLogs(this_00,&term.m_name,name,line_number,character_number);
        std::__cxx11::string::~string((string *)&term);
      }
      local_7c = PARAMETER;
      SymbolTableTerm::SymbolTableTerm(&term,name,&local_7c,local_70);
      SymbolTableTree::Insert(symbol_table_tree,&term);
      SymbolTableTerm::~SymbolTableTerm(&term);
      uVar4 = 2;
      break;
    case 2:
      uVar4 = 3;
      if (SVar3 != COMMA_SYM) {
        return 0;
      }
    }
    SymbolQueue::NextSymbol(handle_correct_queue);
  } while( true );
}

Assistant:

compile_errcode ArgumentList::Action(vector<SymbolType>& argument_type) {
    int ret = COMPILE_OK;
    int state = 0;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        int line_number = handle_correct_queue->GetCurrentLine();
        int character_number = handle_correct_queue->GetCurrentCharacter();
        switch (state) {
            case 0: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    return COMPILE_OK;
                } else if (IsValidVariableType(name)) {
                    if (name == INT_SYM) {
                        argument_type.push_back(INT);
                    } else if (name == CHAR_SYM) {
                        argument_type.push_back(CHAR);
                    } else {
                        fprintf(stderr, "invalid function argument type\n");
                    }
                    state = 1;
                    m_type = name;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == IDENTIFIER_SYM) {
                    m_identifier_name = handle_correct_queue->GetCurrentValue<string>();
                    if (symbol_table_tree->FindTerm(m_identifier_name, true)) {
                        g_log_tools->SemanticErrorLogs(string("repeat definition identifier(para)"), m_identifier_name, line_number, character_number);
                    }
                    SymbolTableTerm term(m_identifier_name, PARAMETER, m_type);
                    symbol_table_tree->Insert(term);
                    state = 2;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 2: {
                if (name == COMMA_SYM) {
                    state = 3;
                    break;
                } else {
                    return COMPILE_OK;
                }
            }
            case 3: {
                if (IsValidVariableType(name)) {
                    if (name == INT_SYM) {
                        argument_type.push_back(INT);
                    } else if (name == CHAR_SYM) {
                        argument_type.push_back(CHAR);
                    } else {
                        fprintf(stderr, "invalid function argument type\n");
                    }
                    state = 1;
                    m_type = name;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
        }
        handle_correct_queue->NextSymbol();
    }
}